

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json.c
# Opt level: O0

char * uo_json_find_value(char *json,char *name)

{
  int iVar1;
  size_t __n;
  ushort **ppuVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  _Bool is_match;
  char *key_end;
  char *key;
  char *right_brace;
  char *p;
  size_t name_len;
  char *name_local;
  char *json_local;
  
  __n = strlen(name);
  right_brace = json;
  while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*right_brace] & 0x2000) != 0) {
    right_brace = right_brace + 1;
  }
  if (*right_brace == '{') {
    do {
      if (*right_brace == '\0') {
        return (char *)0x0;
      }
      pcVar3 = strchr(right_brace,0x7d);
      if (pcVar3 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar4 = strchr(right_brace,0x22);
      if ((pcVar4 == (char *)0x0) || (pcVar3 < pcVar4)) {
        return (char *)0x0;
      }
      pcVar3 = uo_json_find_str_end(pcVar4);
      if (pcVar3 == (char *)0x0) {
        return (char *)0x0;
      }
      bVar5 = false;
      if (__n + 2 == (long)pcVar3 - (long)pcVar4) {
        iVar1 = memcmp(name,pcVar4 + 1,__n);
        bVar5 = iVar1 == 0;
      }
      right_brace = strchr(pcVar3,0x3a);
      if (right_brace == (char *)0x0) {
        return (char *)0x0;
      }
      do {
        right_brace = right_brace + 1;
        ppuVar2 = __ctype_b_loc();
      } while (((*ppuVar2)[(int)*right_brace] & 0x2000) != 0);
      if (bVar5) {
        return right_brace;
      }
      pcVar3 = uo_json_find_end(right_brace);
      if (pcVar3 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar4 = strchr(pcVar3 + 1,0x7d);
      if (pcVar4 == (char *)0x0) {
        return (char *)0x0;
      }
      right_brace = strchr(pcVar3,0x2c);
    } while (right_brace != (char *)0x0);
  }
  return (char *)0x0;
}

Assistant:

char *uo_json_find_value(
    const char *json,
    const char *name)
{
    size_t name_len = strlen(name);

    const char *p = json;

    while (isspace(*p))
        ++p;

    if (*p != '{')
        return NULL;

    while (*p)
    {
        const char *right_brace = strchr(p, '}');
        if (!right_brace)
            return NULL;

        const char *key = strchr(p, '\"');
        if (!key || right_brace < key)
            return NULL;

        const char *key_end = uo_json_find_str_end(key);
        if (!key_end)
            return NULL;

        bool is_match = name_len + 2 == key_end - key
            && memcmp(name, key + 1, name_len) == 0;

        p = strchr(key_end, ':');
        if (!p)
            return NULL;

        ++p;

        while (isspace(*p))
            ++p;

        if (is_match)
            return (char *)p;

        p = uo_json_find_end(p);
        if (!p)
            return NULL;

        right_brace = strchr(p + 1, '}');
        if (!right_brace)
            return NULL;

        p = strchr(p, ',');
        if (!p)
            return NULL;
    }

    return NULL;
}